

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_acs.cpp
# Opt level: O2

void P_MarkGlobalVarStrings(void)

{
  long lVar1;
  
  ACSStringPool::MarkStringArray(&GlobalACSStrings,ACS_GlobalVars,0x40);
  for (lVar1 = 0; lVar1 != 0x600; lVar1 = lVar1 + 0x18) {
    ACSStringPool::MarkStringMap
              (&GlobalACSStrings,(FWorldGlobalArray *)((long)&ACS_GlobalArrays[0].Nodes + lVar1));
  }
  return;
}

Assistant:

void P_MarkGlobalVarStrings()
{
	GlobalACSStrings.MarkStringArray(ACS_GlobalVars, countof(ACS_GlobalVars));
	for (size_t i = 0; i < countof(ACS_GlobalArrays); ++i)
	{
		GlobalACSStrings.MarkStringMap(ACS_GlobalArrays[i]);
	}
}